

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

VectorSet<const_llvm::Value_*> * __thiscall
dg::vr::ValueRelations::getValsByPtr
          (VectorSet<const_llvm::Value_*> *__return_storage_ptr__,ValueRelations *this,V from)

{
  pointer prVar1;
  Handle h;
  HandlePtr pBVar2;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__x;
  
  pBVar2 = maybeGet(this,from);
  if (((pBVar2 == (HandlePtr)0x0) ||
      (prVar1 = (pBVar2->relatedBuckets)._M_elems[10].vec.
                super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      prVar1 == (pBVar2->relatedBuckets)._M_elems[10].vec.
                super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) ||
     (h = prVar1->_M_data, h == (Handle)0x0)) {
    (__return_storage_ptr__->vec).
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vec).
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vec).
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    __x = &getEqual(this,h)->vec;
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
              (&__return_storage_ptr__->vec,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

VectorSet<ValueRelations::V> ValueRelations::getValsByPtr(V from) const {
    HandlePtr mH = maybeGet(from);
    if (!mH)
        return {};
    HandlePtr toH = getHandleByPtr(*mH);
    if (!toH)
        return {};
    return getEqual(*toH);
}